

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

int Abs_GiaCheckTruth(word *pTruth,int nSize,int nSize0)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = (ulong)(uint)(1 << ((char)nSize - 3U & 0x1f));
  if (nSize < 3) {
    uVar7 = 1;
  }
  if ((nSize0 < 1) || (nSize < nSize0)) {
    __assert_fail("nSize0 > 0 && nSize0 <= nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                  ,0x27a,"int Abs_GiaCheckTruth(word *, int, int)");
  }
  iVar6 = (int)uVar7;
  if (nSize0 == 1) {
    uVar4 = 0;
    if (iVar6 < 1) {
      uVar7 = 0;
    }
    do {
      if (uVar7 == uVar4) {
        return 1;
      }
      pbVar1 = (byte *)((long)pTruth + uVar4);
      uVar4 = uVar4 + 1;
    } while ((~(*pbVar1 >> 1 ^ *pbVar1) & 0x55) == 0);
    uVar5 = 0;
  }
  else if (nSize0 == 2) {
    uVar4 = 0;
    if (iVar6 < 1) {
      uVar7 = 0;
    }
    while (((uVar5 = 1, uVar7 != uVar4 &&
            (bVar2 = *(byte *)((long)pTruth + uVar4), uVar5 = 0, (~bVar2 & 0xf0) != 0)) &&
           ((bVar2 & 0xf) != 0xf))) {
      if (bVar2 < 0x10) {
        return 0;
      }
      uVar4 = uVar4 + 1;
      if ((bVar2 & 0xf) == 0) {
        return 0;
      }
    }
  }
  else {
    bVar2 = (char)nSize0 - 3U & 0x1f;
    uVar5 = 1 << bVar2;
    lVar3 = 0;
    uVar7 = 0;
    if (0 < 1 << bVar2) {
      uVar7 = (ulong)uVar5;
    }
    for (; lVar3 < iVar6; lVar3 = lVar3 + (int)uVar5) {
      for (uVar4 = 0;
          (uVar8 = uVar7, uVar7 != uVar4 && (uVar8 = uVar4, *(char *)((long)pTruth + uVar4) == '\0')
          ); uVar4 = uVar4 + 1) {
      }
      if ((uint)uVar8 == uVar5) break;
      for (uVar4 = 0;
          (uVar8 = uVar7, uVar7 != uVar4 && (uVar8 = uVar4, *(char *)((long)pTruth + uVar4) == -1));
          uVar4 = uVar4 + 1) {
      }
      if ((uint)uVar8 == uVar5) break;
      pTruth = (word *)((long)pTruth + (long)(int)uVar5);
    }
    if (iVar6 < (int)lVar3) {
      __assert_fail("i <= nStr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absRpm.c"
                    ,0x299,"int Abs_GiaCheckTruth(word *, int, int)");
    }
    uVar5 = (uint)(iVar6 == (int)lVar3);
  }
  return uVar5;
}

Assistant:

int Abs_GiaCheckTruth( word * pTruth, int nSize, int nSize0 )
{
    unsigned char * pStr = (unsigned char *)pTruth;
    int nStr = (nSize >= 3 ? (1 << (nSize - 3)) : 1);
    int i, k, nSteps;
    assert( nSize0 > 0 && nSize0 <= nSize );
    if ( nSize0 == 1 )
    {
        for ( i = 0; i < nStr; i++ )
            if ( (((unsigned)pStr[i] ^ ((unsigned)pStr[i] >> 1)) & 0x55) != 0x55 )
                return 0;
        return 1;
    }
    if ( nSize0 == 2 )
    {
        for ( i = 0; i < nStr; i++ )
            if ( ((unsigned)pStr[i] & 0xF) == 0x0 || (((unsigned)pStr[i] >> 4) & 0xF) == 0x0 || 
                 ((unsigned)pStr[i] & 0xF) == 0xF || (((unsigned)pStr[i] >> 4) & 0xF) == 0xF  )
                return 0;
        return 1;
    }
    assert( nSize0 >= 3 );
    nSteps = (1 << (nSize0 - 3));
    for ( i = 0; i < nStr; i += nSteps )
    {
        for ( k = 0; k < nSteps; k++ )
            if ( ((unsigned)pStr[i+k] & 0xFF) != 0x00 )
                break;
        if ( k == nSteps )
            break;
        for ( k = 0; k < nSteps; k++ )
            if ( ((unsigned)pStr[i+k] & 0xFF) != 0xFF )
                break;
        if ( k == nSteps )
            break;
    }
    assert( i <= nStr );
    return (int)( i == nStr );
}